

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

string * __thiscall MlmWrap::error(string *__return_storage_ptr__,MlmWrap *this,string *s)

{
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,"[MlmWrap:",&local_81);
  std::operator+(&local_80,&local_40,&this->id);
  std::operator+(&local_60,&local_80,"] ");
  std::operator+(__return_storage_ptr__,&local_60,s);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string MlmWrap::error(const std::string s){
    return std::string("[MlmWrap:") + id + "] " + s;
}